

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O0

void shared_strings_callback_string_data(void *callbackdata,XML_Char *buf,int buflen)

{
  void *pvVar1;
  shared_strings_callback_data *data;
  int buflen_local;
  XML_Char *buf_local;
  void *callbackdata_local;
  
  pvVar1 = realloc(*(void **)((long)callbackdata + 0x20),
                   *(long *)((long)callbackdata + 0x28) + (long)buflen);
  *(void **)((long)callbackdata + 0x20) = pvVar1;
  if (pvVar1 == (void *)0x0) {
    *(undefined8 *)((long)callbackdata + 0x28) = 0;
  }
  else {
    memcpy((void *)(*(long *)((long)callbackdata + 0x20) + *(long *)((long)callbackdata + 0x28)),buf
           ,(long)buflen);
    *(long *)((long)callbackdata + 0x28) = (long)buflen + *(long *)((long)callbackdata + 0x28);
  }
  return;
}

Assistant:

void shared_strings_callback_string_data (void* callbackdata, const XML_Char* buf, int buflen)
{
  struct shared_strings_callback_data* data = (struct shared_strings_callback_data*)callbackdata;
  if ((data->text = XML_Char_realloc(data->text, data->textlen + buflen)) == NULL) {
    //memory allocation error
    data->textlen = 0;
  } else {
    XML_Char_poscpy(data->text, data->textlen, buf, buflen);
    data->textlen += buflen;
  }
}